

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlInput.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlInput::OnAttributeChange
          (ElementFormControlInput *this,ElementAttributes *changed_attributes)

{
  code *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  InputType *pIVar6;
  ElementFormControlInput *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  String new_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  new_type_name._M_dataplus._M_p = (pointer)&new_type_name.field_2;
  new_type_name._M_string_length = 0;
  new_type_name.field_2._M_local_buf[0] = '\0';
  cVar5 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])0x31b6cb);
  if (cVar5._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"text",(allocator<char> *)&local_88);
    Variant::Get<std::__cxx11::string>(&local_80,&(cVar5._M_current)->second,&local_38);
    ::std::__cxx11::string::operator=((string *)&new_type_name,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  pIVar6 = (this->type)._M_t.
           super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
           super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
           super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
  if (pIVar6 == (InputType *)0x0) {
LAB_002f1f54:
    bVar3 = ::std::operator==(&new_type_name,"password");
    local_88 = this;
    if (bVar3) {
      ::std::
      make_unique<Rml::InputTypeText,Rml::ElementFormControlInput*,Rml::InputTypeText::Visibility>
                ((ElementFormControlInput **)&local_80,(Visibility *)&local_88);
    }
    else {
      bVar3 = ::std::operator==(&new_type_name,"radio");
      if (bVar3) {
        ::std::make_unique<Rml::InputTypeRadio,Rml::ElementFormControlInput*>
                  ((ElementFormControlInput **)&local_80);
      }
      else {
        bVar3 = ::std::operator==(&new_type_name,"checkbox");
        if (bVar3) {
          ::std::make_unique<Rml::InputTypeCheckbox,Rml::ElementFormControlInput*>
                    ((ElementFormControlInput **)&local_80);
        }
        else {
          bVar3 = ::std::operator==(&new_type_name,"range");
          if (bVar3) {
            ::std::make_unique<Rml::InputTypeRange,Rml::ElementFormControlInput*>
                      ((ElementFormControlInput **)&local_80);
          }
          else {
            bVar3 = ::std::operator==(&new_type_name,"submit");
            if (bVar3) {
              ::std::make_unique<Rml::InputTypeSubmit,Rml::ElementFormControlInput*>
                        ((ElementFormControlInput **)&local_80);
            }
            else {
              bVar3 = ::std::operator==(&new_type_name,"button");
              if (bVar3) {
                ::std::make_unique<Rml::InputTypeButton,Rml::ElementFormControlInput*>
                          ((ElementFormControlInput **)&local_80);
              }
              else {
                ::std::__cxx11::string::assign((char *)&new_type_name);
                ::std::make_unique<Rml::InputTypeText,Rml::ElementFormControlInput*>
                          ((ElementFormControlInput **)&local_80);
              }
            }
          }
        }
      }
    }
    _Var2._M_p = local_80._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)0x0;
    pIVar6 = (this->type)._M_t.
             super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
             super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
             super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
    (this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>.
    _M_t.super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
    super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl = (InputType *)_Var2._M_p;
    if (pIVar6 != (InputType *)0x0) {
      (*pIVar6->_vptr_InputType[1])();
      if ((InputType *)local_80._M_dataplus._M_p != (InputType *)0x0) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
    }
    if ((this->type_name)._M_string_length != 0) {
      Element::SetClass((Element *)this,&this->type_name,false);
    }
    Element::SetClass((Element *)this,&new_type_name,true);
    ::std::__cxx11::string::_M_assign((string *)&this->type_name);
    (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x15])(this);
  }
  else {
    if (new_type_name._M_string_length == 0) goto LAB_002f211d;
    bVar3 = ::std::operator!=(&new_type_name,&this->type_name);
    if (bVar3) {
      pIVar6 = (this->type)._M_t.
               super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
               super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
               super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
      (this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>.
      _M_t.super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
      super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl = (InputType *)0x0;
      if (pIVar6 != (InputType *)0x0) {
        (*pIVar6->_vptr_InputType[1])();
      }
      goto LAB_002f1f54;
    }
  }
  pIVar6 = (this->type)._M_t.
           super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
           super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
           super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
  if (pIVar6 == (InputType *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(type)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Elements/ElementFormControlInput.cpp"
                   ,0x9e);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pIVar6 = (this->type)._M_t.
             super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
             super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
             super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
  }
LAB_002f211d:
  iVar4 = (*pIVar6->_vptr_InputType[8])(pIVar6,changed_attributes);
  if ((char)iVar4 == '\0') {
    (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x15])(this);
  }
  ::std::__cxx11::string::~string((string *)&new_type_name);
  return;
}

Assistant:

void ElementFormControlInput::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	ElementFormControl::OnAttributeChange(changed_attributes);

	String new_type_name;

	auto it_type = changed_attributes.find("type");
	if (it_type != changed_attributes.end())
	{
		new_type_name = it_type->second.Get<String>("text");
	}

	if (!type || (!new_type_name.empty() && new_type_name != type_name))
	{
		// Reset the existing type before constructing a new one. This ensures the old type removes properties and event
		// listeners attached to this element, so it does not interfere with new ones being attached by the new type.
		type.reset();

		if (new_type_name == "password")
			type = MakeUnique<InputTypeText>(this, InputTypeText::OBSCURED);
		else if (new_type_name == "radio")
			type = MakeUnique<InputTypeRadio>(this);
		else if (new_type_name == "checkbox")
			type = MakeUnique<InputTypeCheckbox>(this);
		else if (new_type_name == "range")
			type = MakeUnique<InputTypeRange>(this);
		else if (new_type_name == "submit")
			type = MakeUnique<InputTypeSubmit>(this);
		else if (new_type_name == "button")
			type = MakeUnique<InputTypeButton>(this);
		else
		{
			new_type_name = "text";
			type = MakeUnique<InputTypeText>(this);
		}

		if (!type_name.empty())
			SetClass(type_name, false);
		SetClass(new_type_name, true);
		type_name = new_type_name;

		DirtyLayout();
	}

	RMLUI_ASSERT(type);

	if (!type->OnAttributeChange(changed_attributes))
		DirtyLayout();
}